

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# robin_hash.h
# Opt level: O2

void __thiscall
tsl::detail_robin_hash::
robin_hash<std::pair<unsigned_long,_ImputedData<long,_double>_>,_tsl::robin_map<unsigned_long,_ImputedData<long,_double>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_ImputedData<long,_double>_>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::KeySelect,_tsl::robin_map<unsigned_long,_ImputedData<long,_double>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_ImputedData<long,_double>_>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::ValueSelect,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_ImputedData<long,_double>_>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
::insert_value_impl(robin_hash<std::pair<unsigned_long,_ImputedData<long,_double>_>,_tsl::robin_map<unsigned_long,_ImputedData<long,_double>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_ImputedData<long,_double>_>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::KeySelect,_tsl::robin_map<unsigned_long,_ImputedData<long,_double>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_ImputedData<long,_double>_>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::ValueSelect,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_ImputedData<long,_double>_>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
                    *this,size_t ibucket,distance_type dist_from_ideal_bucket,
                   truncated_hash_type hash,value_type *value)

{
  bucket_entry *pbVar1;
  short sVar2;
  ulong uVar3;
  short __tmp;
  short __tmp_1;
  distance_type dVar4;
  short sVar5;
  ulong uVar6;
  
  pbVar1 = this->m_buckets + ibucket;
  std::pair<unsigned_long,_ImputedData<long,_double>_>::swap
            (value,(pair<unsigned_long,_ImputedData<long,_double>_> *)pbVar1->m_value);
  dVar4 = pbVar1->m_dist_from_ideal_bucket;
  pbVar1->m_dist_from_ideal_bucket = dist_from_ideal_bucket;
  uVar6 = ibucket + 1;
  uVar3 = (this->super_power_of_two_growth_policy<2UL>).m_mask;
  while( true ) {
    uVar6 = uVar6 & uVar3;
    sVar5 = dVar4 + 1;
    pbVar1 = this->m_buckets + uVar6;
    sVar2 = this->m_buckets[uVar6].m_dist_from_ideal_bucket;
    if (sVar2 == -1) break;
    dVar4 = sVar5;
    if (sVar2 < sVar5) {
      if (0x2000 < sVar5) {
        this->m_grow_on_next_insert = true;
      }
      std::pair<unsigned_long,_ImputedData<long,_double>_>::swap
                (value,(pair<unsigned_long,_ImputedData<long,_double>_> *)pbVar1->m_value);
      dVar4 = pbVar1->m_dist_from_ideal_bucket;
      pbVar1->m_dist_from_ideal_bucket = sVar5;
      uVar3 = (this->super_power_of_two_growth_policy<2UL>).m_mask;
    }
    uVar6 = uVar6 + 1;
  }
  std::pair<unsigned_long,_ImputedData<long,_double>_>::pair
            ((pair<unsigned_long,_ImputedData<long,_double>_> *)pbVar1->m_value,value);
  pbVar1->m_dist_from_ideal_bucket = sVar5;
  return;
}

Assistant:

void insert_value_impl(std::size_t ibucket,
                         distance_type dist_from_ideal_bucket,
                         truncated_hash_type hash, value_type& value) {
    tsl_rh_assert(dist_from_ideal_bucket >
                  m_buckets[ibucket].dist_from_ideal_bucket());
    m_buckets[ibucket].swap_with_value_in_bucket(dist_from_ideal_bucket, hash,
                                                 value);
    ibucket = next_bucket(ibucket);
    dist_from_ideal_bucket++;

    while (!m_buckets[ibucket].empty()) {
      if (dist_from_ideal_bucket >
          m_buckets[ibucket].dist_from_ideal_bucket()) {
        if (dist_from_ideal_bucket >
            bucket_entry::DIST_FROM_IDEAL_BUCKET_LIMIT) {
          /**
           * The number of probes is really high, rehash the map on the next
           * insert. Difficult to do now as rehash may throw an exception.
           */
          m_grow_on_next_insert = true;
        }

        m_buckets[ibucket].swap_with_value_in_bucket(dist_from_ideal_bucket,
                                                     hash, value);
      }

      ibucket = next_bucket(ibucket);
      dist_from_ideal_bucket++;
    }

    m_buckets[ibucket].set_value_of_empty_bucket(dist_from_ideal_bucket, hash,
                                                 std::move(value));
  }